

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_algebraic.h
# Opt level: O0

void __thiscall
mp::AlgebraicExpression<mp::LinTerms>::AlgebraicExpression
          (AlgebraicExpression<mp::LinTerms> *this,Variable i)

{
  LinTerms *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  double in_stack_ffffffffffffffe8;
  LinTerms *this_00;
  
  this_00 = in_RDI;
  LinTerms::LinTerms((LinTerms *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  in_RDI[1].coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr = (ptr)0x0;
  LinTerms::add_term(this_00,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  return;
}

Assistant:

AlgebraicExpression(Variable i) { Body::add_term(1.0, i.v); }